

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O2

cookie * __thiscall cppcms::http::cookie::operator=(cookie *this,cookie *other)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  booster::copy_ptr<cppcms::http::cookie::_data>::operator=(&this->d,&other->d);
  std::__cxx11::string::operator=((string *)&this->name_,(string *)&other->name_);
  std::__cxx11::string::operator=((string *)&this->value_,(string *)&other->value_);
  std::__cxx11::string::operator=((string *)&this->path_,(string *)&other->path_);
  std::__cxx11::string::operator=((string *)&this->domain_,(string *)&other->domain_);
  std::__cxx11::string::operator=((string *)&this->comment_,(string *)&other->comment_);
  this->max_age_ = other->max_age_;
  this->expires_ = other->expires_;
  uVar2 = *(uint *)&other->field_0xb8 & 1;
  uVar1 = *(uint *)&this->field_0xb8;
  *(uint *)&this->field_0xb8 = uVar1 & 0xfffffffe | uVar2;
  uVar3 = *(uint *)&other->field_0xb8 & 2;
  *(uint *)&this->field_0xb8 = uVar1 & 0xfffffffc | uVar2 | uVar3;
  uVar4 = *(uint *)&other->field_0xb8 & 4;
  *(uint *)&this->field_0xb8 = uVar1 & 0xfffffff8 | uVar2 | uVar3 | uVar4;
  uVar5 = *(uint *)&other->field_0xb8 & 8;
  *(uint *)&this->field_0xb8 = uVar1 & 0xfffffff0 | uVar2 | uVar3 | uVar4 | uVar5;
  uVar6 = *(uint *)&other->field_0xb8 & 0x10;
  *(uint *)&this->field_0xb8 = uVar1 & 0xffffffe0 | uVar2 | uVar3 | uVar4 | uVar5 | uVar6;
  uVar7 = *(uint *)&other->field_0xb8 & 0x20;
  *(uint *)&this->field_0xb8 = uVar1 & 0xffffffc0 | uVar2 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7;
  *(uint *)&this->field_0xb8 =
       uVar1 & 0xffffff80 | uVar2 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 |
       *(uint *)&other->field_0xb8 & 0x40;
  return this;
}

Assistant:

cookie &cookie::operator=(cookie &&other)
{
	d=std::move(other.d);
	name_=std::move(other.name_);
	value_=std::move(other.value_);
	path_=std::move(other.path_);
	domain_=std::move(other.domain_);
	comment_=std::move(other.comment_);
	max_age_=other.max_age_;
	expires_=other.expires_;
	secure_=other.secure_;
	has_age_=other.has_age_;
	has_expiration_ = other.has_expiration_;
	httponly_ = other.httponly_;
	samesite_none_ = other.samesite_none_;
	samesite_lax_ = other.samesite_lax_;
	samesite_strict_ = other.samesite_strict_;
	return *this;
}